

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O0

void libtorrent::aux::write_address<std::back_insert_iterator<std::__cxx11::string>>
               (address *a,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *out)

{
  bool bVar1;
  uint_type val;
  iterator pvVar2;
  value_type_conflict3 b;
  iterator __end4;
  iterator __begin4;
  array<unsigned_char,_16UL> local_38;
  array<unsigned_char,_16UL> *local_28;
  bytes_type *__range4;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *out_local;
  address *a_local;
  
  local_18 = out;
  out_local = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)a;
  bVar1 = boost::asio::ip::address::is_v4(a);
  if (bVar1) {
    boost::asio::ip::address::to_v4((address *)((long)&__range4 + 4));
    val = boost::asio::ip::address_v4::to_uint((address_v4 *)((long)&__range4 + 4));
    write_uint32<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>(val,local_18);
  }
  else {
    bVar1 = boost::asio::ip::address::is_v6((address *)out_local);
    if (bVar1) {
      boost::asio::ip::address::to_v6((address_v6 *)&__begin4,(address *)out_local);
      local_38._M_elems = (_Type)boost::asio::ip::address_v6::to_bytes((address_v6 *)&__begin4);
      local_28 = &local_38;
      __end4 = ::std::array<unsigned_char,_16UL>::begin(local_28);
      pvVar2 = ::std::array<unsigned_char,_16UL>::end(local_28);
      for (; __end4 != pvVar2; __end4 = __end4 + 1) {
        write_uint8<unsigned_char,std::back_insert_iterator<std::__cxx11::string>>(*__end4,local_18)
        ;
      }
    }
  }
  return;
}

Assistant:

void write_address(address const& a, OutIt&& out)
	{
		if (a.is_v4())
		{
			write_uint32(a.to_v4().to_uint(), out);
		}
		else if (a.is_v6())
		{
			for (auto b : a.to_v6().to_bytes())
				write_uint8(b, out);
		}
	}